

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void resolveAlias(Parse *pParse,ExprList *pEList,int iCol,Expr *pExpr,char *zType,int nSubquery)

{
  sqlite3 *db_00;
  char *pcVar1;
  sqlite3 *db;
  Expr *pDup;
  Expr *pOrig;
  int nSubquery_local;
  char *zType_local;
  Expr *pExpr_local;
  int iCol_local;
  ExprList *pEList_local;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  db = (sqlite3 *)sqlite3ExprDup(db_00,pEList->a[iCol].pExpr,0);
  if (db != (sqlite3 *)0x0) {
    if (*zType != 'G') {
      incrAggFunctionDepth((Expr *)db,nSubquery);
    }
    if (pExpr->op == 'f') {
      db = (sqlite3 *)sqlite3ExprAddCollateString(pParse,(Expr *)db,(pExpr->u).zToken);
    }
    *(uint *)((long)&db->pVfs + 4) = *(uint *)((long)&db->pVfs + 4) | 0x400000;
    pExpr->flags = pExpr->flags | 0x8000;
    sqlite3ExprDelete(db_00,pExpr);
    memcpy(pExpr,db,0x50);
    if (((pExpr->flags & 0x400) == 0) && ((pExpr->u).zToken != (char *)0x0)) {
      pcVar1 = sqlite3DbStrDup(db_00,(pExpr->u).zToken);
      (pExpr->u).zToken = pcVar1;
      pExpr->flags = pExpr->flags | 0x10000;
    }
    sqlite3DbFree(db_00,db);
  }
  pExpr->flags = pExpr->flags | 0x400000;
  return;
}

Assistant:

static void resolveAlias(
  Parse *pParse,         /* Parsing context */
  ExprList *pEList,      /* A result set */
  int iCol,              /* A column in the result set.  0..pEList->nExpr-1 */
  Expr *pExpr,           /* Transform this into an alias to the result set */
  const char *zType,     /* "GROUP" or "ORDER" or "" */
  int nSubquery          /* Number of subqueries that the label is moving */
){
  Expr *pOrig;           /* The iCol-th column of the result set */
  Expr *pDup;            /* Copy of pOrig */
  sqlite3 *db;           /* The database connection */

  assert( iCol>=0 && iCol<pEList->nExpr );
  pOrig = pEList->a[iCol].pExpr;
  assert( pOrig!=0 );
  db = pParse->db;
  pDup = sqlite3ExprDup(db, pOrig, 0);
  if( pDup!=0 ){
    if( zType[0]!='G' ) incrAggFunctionDepth(pDup, nSubquery);
    if( pExpr->op==TK_COLLATE ){
      pDup = sqlite3ExprAddCollateString(pParse, pDup, pExpr->u.zToken);
    }
    ExprSetProperty(pDup, EP_Alias);

    /* Before calling sqlite3ExprDelete(), set the EP_Static flag. This 
    ** prevents ExprDelete() from deleting the Expr structure itself,
    ** allowing it to be repopulated by the memcpy() on the following line.
    ** The pExpr->u.zToken might point into memory that will be freed by the
    ** sqlite3DbFree(db, pDup) on the last line of this block, so be sure to
    ** make a copy of the token before doing the sqlite3DbFree().
    */
    ExprSetProperty(pExpr, EP_Static);
    sqlite3ExprDelete(db, pExpr);
    memcpy(pExpr, pDup, sizeof(*pExpr));
    if( !ExprHasProperty(pExpr, EP_IntValue) && pExpr->u.zToken!=0 ){
      assert( (pExpr->flags & (EP_Reduced|EP_TokenOnly))==0 );
      pExpr->u.zToken = sqlite3DbStrDup(db, pExpr->u.zToken);
      pExpr->flags |= EP_MemToken;
    }
    sqlite3DbFree(db, pDup);
  }
  ExprSetProperty(pExpr, EP_Alias);
}